

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_font.cpp
# Opt level: O0

void __thiscall FSingleLumpFont::LoadFON1(FSingleLumpFont *this,int lump,BYTE *data)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  CharData *pCVar5;
  BYTE *pBVar6;
  uint local_2c;
  uint i;
  int h;
  int w;
  BYTE *data_local;
  int lump_local;
  FSingleLumpFont *this_local;
  
  pCVar5 = (CharData *)operator_new__(0x1000);
  (this->super_FFont).Chars = pCVar5;
  bVar1 = data[4];
  bVar2 = data[5];
  bVar3 = data[6];
  bVar4 = data[7];
  this->FontType = FONT1;
  (this->super_FFont).FontHeight = (uint)bVar3 + (uint)bVar4 * 0x100;
  (this->super_FFont).SpaceWidth = (uint)bVar1 + (uint)bVar2 * 0x100;
  (this->super_FFont).FirstChar = 0;
  (this->super_FFont).LastChar = 0xff;
  (this->super_FFont).GlobalKerning = 0;
  pBVar6 = (BYTE *)operator_new__(0x100);
  (this->super_FFont).PatchRemap = pBVar6;
  for (local_2c = 0; local_2c < 0x100; local_2c = local_2c + 1) {
    (this->super_FFont).Chars[local_2c].Pic = (FTexture *)0x0;
  }
  (*(this->super_FFont)._vptr_FFont[4])();
  return;
}

Assistant:

void FSingleLumpFont::LoadFON1 (int lump, const BYTE *data)
{
	int w, h;

	Chars = new CharData[256];

	w = data[4] + data[5]*256;
	h = data[6] + data[7]*256;

	FontType = FONT1;
	FontHeight = h;
	SpaceWidth = w;
	FirstChar = 0;
	LastChar = 255;
	GlobalKerning = 0;
	PatchRemap = new BYTE[256];

	for(unsigned int i = 0;i < 256;++i)
		Chars[i].Pic = NULL;

	LoadTranslations();
}